

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

string * __thiscall
lan::db::prepare_char_to_write_abi_cxx11_(string *__return_storage_ptr__,db *this,char src)

{
  string local_40 [8];
  string temp;
  char src_local;
  db *this_local;
  string *dst;
  
  temp.field_2._M_local_buf[0xe] = '\0';
  temp.field_2._M_local_buf[0xf] = src;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string(local_40);
  if ((temp.field_2._M_local_buf[0xf] == '\"') || (temp.field_2._M_local_buf[0xf] == '\\')) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\");
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,temp.field_2._M_local_buf[0xf]);
  temp.field_2._M_local_buf[0xe] = '\x01';
  std::__cxx11::string::~string(local_40);
  if ((temp.field_2._M_local_buf[0xe] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::prepare_char_to_write(char src){
            std::string dst, temp ;
            if(src == '\"' or src == '\\') dst += "\\";
            dst += src;
            return dst;
        }